

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey.c
# Opt level: O2

void ssort1(string *x,int n,int depth)

{
  byte bVar1;
  byte bVar2;
  string puVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int n_00;
  int n_01;
  long lVar9;
  int i;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar13 = (ulong)(uint)n;
LAB_00222513:
  iVar11 = (int)uVar13;
  if (iVar11 < 2) {
    return;
  }
  iVar4 = rand();
  puVar3 = *x;
  *x = x[iVar4 % iVar11];
  x[iVar4 % iVar11] = puVar3;
  bVar1 = (*x)[depth];
  uVar12 = iVar11 - 1;
  lVar10 = 1;
  iVar4 = 1;
  uVar8 = uVar12;
  do {
    lVar6 = (long)(int)lVar10;
    lVar9 = (long)(int)uVar8;
    lVar7 = lVar9 + 1;
    if (lVar9 + 1 <= lVar6) {
      lVar7 = lVar6;
    }
    for (; lVar10 = lVar7, lVar7 != lVar6; lVar6 = lVar6 + 1) {
      bVar2 = x[lVar6][depth];
      lVar10 = lVar6;
      if (bVar1 < bVar2) break;
      if (bVar2 == bVar1) {
        puVar3 = x[iVar4];
        x[iVar4] = x[lVar6];
        x[lVar6] = puVar3;
        iVar4 = iVar4 + 1;
      }
    }
    i = (int)lVar10;
    lVar7 = (long)i;
    lVar6 = lVar9 << 0x20;
    while( true ) {
      if (lVar9 < lVar7) {
        n_00 = i - iVar4;
        n_01 = n_00;
        if (iVar4 < n_00) {
          n_01 = iVar4;
        }
        vecswap(0,i - n_01,n_01,x);
        uVar5 = uVar12 - (int)lVar9;
        uVar8 = ~uVar12 + iVar11;
        if ((int)uVar5 < (int)uVar8) {
          uVar8 = uVar5;
        }
        vecswap(i,iVar11 - uVar8,uVar8,x);
        ssort1(x,n_00,depth);
        if (x[n_00][depth] != '\0') {
          ssort1(x + n_00,iVar4 + iVar11 + ~uVar12,depth + 1);
        }
        x = x + (uVar13 - (long)(int)uVar5);
        uVar13 = (ulong)uVar5;
        goto LAB_00222513;
      }
      puVar3 = x[lVar9];
      bVar2 = puVar3[depth];
      if (bVar2 < bVar1) break;
      if (bVar2 == bVar1) {
        x[lVar9] = x[(int)uVar12];
        x[(int)uVar12] = puVar3;
        uVar12 = uVar12 - 1;
      }
      lVar9 = lVar9 + -1;
      lVar6 = lVar6 + -0x100000000;
    }
    puVar3 = x[lVar7];
    x[lVar7] = *(string *)((long)x + (lVar6 >> 0x1d));
    *(string *)((long)x + (lVar6 >> 0x1d)) = puVar3;
    lVar10 = lVar10 + 1;
    uVar8 = (int)lVar9 - 1;
  } while( true );
}

Assistant:

static void ssort1(string x[], int n, int depth)
{   int    a, b, c, d, r, v;
    if (n <= 1)
        return;
    a = rand() % n;
    swap(0, a);
    v = i2c(0);
    a = b = 1;
    c = d = n-1;
    for (;;) {
        while (b <= c && (r = i2c(b)-v) <= 0) {
            if (r == 0) { swap(a, b); a++; }
            b++;
        }
        while (b <= c && (r = i2c(c)-v) >= 0) {
            if (r == 0) { swap(c, d); d--; }
            c--;
        }
        if (b > c) break;
        swap(b, c);
        b++;
        c--;
    }
    r = min(a, b-a);     vecswap(0, b-r, r, x);
    r = min(d-c, n-d-1); vecswap(b, n-r, r, x);
    r = b-a; ssort1(x, r, depth);
    if (i2c(r) != 0)
        ssort1(x + r, a + n-d-1, depth+1);
    r = d-c; ssort1(x + n-r, r, depth);
}